

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::WriteAmpEnable(AmpIO *this,uint32_t mask,uint32_t state)

{
  BasePort *pBVar1;
  byte bVar2;
  uint32_t uVar3;
  int iVar4;
  __uint32_t _Var5;
  uint uVar6;
  uint uVar7;
  uint local_7c;
  uint32_t iMask;
  uint32_t i;
  quadlet_t localBuffer [18];
  bool local_21;
  quadlet_t write_data;
  bool ret;
  uint32_t state_local;
  uint32_t mask_local;
  AmpIO *this_local;
  
  if ((this->super_FpgaIO).super_BoardIO.port == (BasePort *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar3 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar3 == 0x514c4131) {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      iVar4 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0,
                         (ulong)(mask << 8 | state));
      bVar2 = (byte)iVar4;
    }
    else {
      _Var5 = __bswap_32(((this->super_FpgaIO).super_BoardIO.BoardId & 0xf) << 8 |
                         this->NumMotors + 2 & 0xff);
      (&iMask)[this->WB_HEADER_OFFSET] = _Var5;
      for (local_7c = 0; local_7c < this->NumMotors; local_7c = local_7c + 1) {
        uVar7 = 1 << ((byte)local_7c & 0x1f);
        (&iMask)[this->WB_CURR_OFFSET + local_7c] = 0;
        if ((mask & uVar7) != 0) {
          _Var5 = __bswap_32(0x20000000);
          uVar6 = this->WB_CURR_OFFSET + local_7c;
          (&iMask)[uVar6] = _Var5 | (&iMask)[uVar6];
          if ((state & uVar7) != 0) {
            _Var5 = __bswap_32(0x10000000);
            uVar7 = this->WB_CURR_OFFSET + local_7c;
            (&iMask)[uVar7] = _Var5 | (&iMask)[uVar7];
          }
        }
      }
      (&iMask)[this->WB_CTRL_OFFSET] = 0;
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      bVar2 = (this->super_FpgaIO).super_BoardIO.BoardId;
      uVar7 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[3])();
      iVar4 = (*pBVar1->_vptr_BasePort[0x27])(pBVar1,(ulong)bVar2,0,&iMask,(ulong)uVar7);
      bVar2 = (byte)iVar4;
    }
    local_21 = (bool)(bVar2 & 1);
    this_local._7_1_ = local_21;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::WriteAmpEnable(uint32_t mask, uint32_t state)
{
    if (!port)
        return false;

    bool ret;
    if (GetHardwareVersion() == QLA1_String) {
        // Following still works for Firmware Rev 8 (at least for QLA)
        quadlet_t write_data = (mask << 8) | state;
        ret = port->WriteQuadlet(BoardId, BoardIO::BOARD_STATUS, write_data);
    }
    else {
        // For other boards, it is necessary to do a block write
        quadlet_t localBuffer[MAX_CHANNELS+2];
        localBuffer[WB_HEADER_OFFSET] = bswap_32((BoardId & 0x0F) << 8 | ((NumMotors+2) & 0xFF));
        for (uint32_t i = 0; i < NumMotors; i++) {
            uint32_t iMask = (1 << i);
            localBuffer[WB_CURR_OFFSET+i] = 0;
            if (mask & iMask) {
                localBuffer[WB_CURR_OFFSET+i] |= bswap_32(MOTOR_ENABLE_MASK);
                if (state & iMask) {
                    localBuffer[WB_CURR_OFFSET+i] |=  bswap_32(MOTOR_ENABLE_BIT);
                }
            }
        }
        localBuffer[WB_CTRL_OFFSET] = 0;
        ret = port->WriteBlock(BoardId, 0, localBuffer, GetWriteNumBytes());
    }
    return ret;
}